

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void GetFormalArgsArray(ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
                       PropertyIdArray *propIds)

{
  ParseNodeFnc *pPVar1;
  ParseNode *pnode;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ParseNodePtr pnode_00;
  anon_class_32_4_fdc6cb32 local_60;
  ByteCodeGenerator *local_40;
  ByteCodeGenerator *byteCodeGenerator_local;
  PropertyIdArray *propIds_local;
  ArgSlot i;
  bool hadDuplicates;
  
  local_40 = byteCodeGenerator;
  byteCodeGenerator_local = (ByteCodeGenerator *)propIds;
  if (funcInfo == (FuncInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1f0,"(funcInfo)","funcInfo");
    if (!bVar3) goto LAB_00756850;
    *puVar4 = 0;
  }
  if (propIds == (PropertyIdArray *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1f1,"(propIds)","propIds");
    if (!bVar3) goto LAB_00756850;
    *puVar4 = 0;
  }
  if (byteCodeGenerator == (ByteCodeGenerator *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1f2,"(byteCodeGenerator)","byteCodeGenerator");
    if (!bVar3) {
LAB_00756850:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  local_60.hadDuplicates = (bool *)((long)&propIds_local + 7);
  propIds_local._7_1_ = 0;
  local_60.i = (ArgSlot *)((long)&propIds_local + 4);
  propIds_local._4_2_ = 0;
  pPVar1 = funcInfo->root;
  local_60.propIds = (PropertyIdArray **)&byteCodeGenerator_local;
  local_60.byteCodeGenerator = &local_40;
  for (pnode_00 = pPVar1->pnodeParams; pnode_00 != (ParseNode *)0x0;
      pnode_00 = ParseNode::GetFormalNext(pnode_00)) {
    GetFormalArgsArray::anon_class_32_4_fdc6cb32::operator()(&local_60,pnode_00);
  }
  pnode = pPVar1->pnodeRest;
  if (pnode != (ParseNode *)0x0) {
    GetFormalArgsArray::anon_class_32_4_fdc6cb32::operator()(&local_60,pnode);
  }
  *(undefined1 *)((long)&byteCodeGenerator_local->scriptContext + 5) = propIds_local._7_1_;
  return;
}

Assistant:

void GetFormalArgsArray(ByteCodeGenerator *byteCodeGenerator, FuncInfo * funcInfo, Js::PropertyIdArray *propIds)
{
    Assert(funcInfo);
    Assert(propIds);
    Assert(byteCodeGenerator);

    bool hadDuplicates = false;
    Js::ArgSlot i = 0;

    auto processArg = [&](ParseNode *pnode)
    {
        if (pnode->IsVarLetOrConst())
        {
            Assert(i < propIds->count);
            Symbol *sym = pnode->AsParseNodeVar()->sym;
            Assert(sym);
            Js::PropertyId symPos = sym->EnsurePosition(byteCodeGenerator);

            //
            // Check if the function has any same name parameters
            // For the same name param, only the last one will be passed the correct propertyid
            // For remaining dup param names, pass Constants::NoProperty
            //
            for (Js::ArgSlot j = 0; j < i; j++)
            {
                if (propIds->elements[j] == symPos)
                {
                    // Found a dup parameter name
                    propIds->elements[j] = Js::Constants::NoProperty;
                    hadDuplicates = true;
                    break;
                }
            }
            propIds->elements[i] = symPos;
        }
        else
        {
            propIds->elements[i] = Js::Constants::NoProperty;
        }
        ++i;
    };
    MapFormals(funcInfo->root, processArg);

    propIds->hadDuplicates = hadDuplicates;
}